

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 8) {
      return 1;
    }
    sVar2 = stbi__get8(s);
    psVar1 = stbi__check_png_header::png_sig + lVar3;
    lVar3 = lVar3 + 1;
  } while (sVar2 == *psVar1);
  stbi__g_failure_reason = "bad png sig";
  return 0;
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}